

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcstest.c
# Opt level: O2

int main(void)

{
  int iVar1;
  jpeg_compress_struct cinfo;
  error_mgr jerr;
  
  puts("libjpeg-turbo colorspace extensions:");
  puts("  Present at compile time");
  cinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr);
  jerr.pub.error_exit = my_error_exit;
  jerr.pub.output_message = my_output_message;
  iVar1 = _setjmp((__jmp_buf_tag *)jerr.jb);
  if (iVar1 == 0) {
    jpeg_CreateCompress(&cinfo,0x3e,0x208);
    cinfo.input_components = 3;
    jpeg_set_defaults(&cinfo);
    cinfo.in_color_space = JCS_EXT_RGB;
    jpeg_default_colorspace(&cinfo);
    puts("  Working properly");
  }
  else {
    printf("  Not working properly.  Error returned was:\n    %s\n",lasterror);
  }
  puts("libjpeg-turbo alpha colorspace extensions:");
  puts("  Present at compile time");
  iVar1 = _setjmp((__jmp_buf_tag *)jerr.jb);
  if (iVar1 == 0) {
    cinfo.in_color_space = JCS_EXT_RGBA;
    jpeg_default_colorspace();
    puts("  Working properly");
  }
  else {
    printf("  Not working properly.  Error returned was:\n    %s\n",lasterror);
  }
  jpeg_destroy_compress(&cinfo);
  return 0;
}

Assistant:

int main(void)
{
  int jcs_valid = -1, jcs_alpha_valid = -1;
  struct jpeg_compress_struct cinfo;
  error_mgr jerr;

  printf("libjpeg-turbo colorspace extensions:\n");
#if JCS_EXTENSIONS
  printf("  Present at compile time\n");
#else
  printf("  Not present at compile time\n");
#endif

  cinfo.err = jpeg_std_error(&jerr.pub);
  jerr.pub.error_exit = my_error_exit;
  jerr.pub.output_message = my_output_message;

  if (setjmp(jerr.jb)) {
    /* this will execute if libjpeg has an error */
    jcs_valid = 0;
    goto done;
  }

  jpeg_create_compress(&cinfo);
  cinfo.input_components = 3;
  jpeg_set_defaults(&cinfo);
  cinfo.in_color_space = JCS_EXT_RGB;
  jpeg_default_colorspace(&cinfo);
  jcs_valid = 1;

done:
  if (jcs_valid)
    printf("  Working properly\n");
  else
    printf("  Not working properly.  Error returned was:\n    %s\n",
           lasterror);

  printf("libjpeg-turbo alpha colorspace extensions:\n");
#if JCS_ALPHA_EXTENSIONS
  printf("  Present at compile time\n");
#else
  printf("  Not present at compile time\n");
#endif

  if (setjmp(jerr.jb)) {
    /* this will execute if libjpeg has an error */
    jcs_alpha_valid = 0;
    goto done2;
  }

  cinfo.in_color_space = JCS_EXT_RGBA;
  jpeg_default_colorspace(&cinfo);
  jcs_alpha_valid = 1;

done2:
  if (jcs_alpha_valid)
    printf("  Working properly\n");
  else
    printf("  Not working properly.  Error returned was:\n    %s\n",
           lasterror);

  jpeg_destroy_compress(&cinfo);
  return 0;
}